

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O3

void __thiscall
libtorrent::dht_direct_response_alert::~dht_direct_response_alert(dht_direct_response_alert *this)

{
  operator_delete(this,0x50);
  return;
}

Assistant:

struct TORRENT_EXPORT dht_direct_response_alert final : alert
	{
		// internal
		TORRENT_UNEXPORT dht_direct_response_alert(aux::stack_allocator& alloc, client_data_t userdata
			, udp::endpoint const& addr, bdecode_node const& response);

		// internal
		// for when there was a timeout so we don't have a response
		TORRENT_UNEXPORT dht_direct_response_alert(aux::stack_allocator& alloc, client_data_t userdata
			, udp::endpoint const& addr);

		TORRENT_DEFINE_ALERT_PRIO(dht_direct_response_alert, 88, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::dht;
		std::string message() const override;

		client_data_t userdata;
		aux::noexcept_movable<udp::endpoint> endpoint;

		bdecode_node response() const;

	private:
		std::reference_wrapper<aux::stack_allocator> m_alloc;
		aux::allocation_slot m_response_idx;
		int const m_response_size;
#if TORRENT_ABI_VERSION == 1
	public:
		TORRENT_DEPRECATED aux::noexcept_movable<udp::endpoint> addr;
#endif
	}